

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O3

logical pnga_update44_ghosts(Integer g_a)

{
  long lVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  global_array_t *pgVar5;
  int _d;
  Integer proc;
  logical lVar6;
  Integer *map;
  ulong *puVar7;
  ulong uVar8;
  size_t sVar9;
  Integer IVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  Integer _last;
  char *pcVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  short sVar26;
  int _ndim_4;
  long lVar27;
  ulong uVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  int local_6e8;
  int _ndim;
  int msglen;
  int _ndim_6;
  long local_6c8;
  char *local_6c0;
  long local_6b8;
  char *local_6b0;
  ulong local_6a8;
  ulong local_6a0;
  long local_698;
  long local_690;
  ulong local_688;
  int local_67c;
  long local_678;
  long local_670;
  long local_668;
  long local_660;
  ulong *local_658;
  uint local_64c;
  int _index [7];
  Integer _hi [7];
  Integer np;
  long local_5a0;
  int count [7];
  Integer shi_rcv [7];
  Integer slo_rcv [7];
  int stride_rcv [7];
  int stride_snd [7];
  char err_string [256];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer index [7];
  Integer plo_rcv [7];
  Integer plo_snd [7];
  Integer width [7];
  Integer ld_loc [7];
  Integer phi_rcv [7];
  Integer phi_snd [7];
  Integer hi_rcv [7];
  Integer lo_rcv [7];
  Integer dims [7];
  Integer increment [7];
  char rcv_name [32];
  char send_name [32];
  
  proc = pnga_nodeid();
  lVar6 = pnga_has_ghosts(g_a);
  pgVar5 = GA;
  if (lVar6 == 0) {
    return 1;
  }
  lVar1 = g_a + 1000;
  local_6c8 = lVar1 * 0x368;
  local_688 = (ulong)(uint)GA[lVar1].elemsize;
  lVar31 = (long)GA[lVar1].ndim;
  iVar3 = GA[lVar1].p_handle;
  local_690 = g_a;
  if (0 < lVar31) {
    sVar9 = lVar31 * 8;
    memset(increment,0,sVar9);
    lVar1 = local_690;
    memcpy(width,pgVar5[local_690 + 1000].width,sVar9);
    g_a = local_690;
    memcpy(dims,pgVar5[lVar1 + 1000].dims,sVar9);
  }
  local_6b8 = lVar31;
  lVar6 = gai_check_ghost_distr(g_a);
  IVar10 = GAnproc;
  if (lVar6 == 0) {
    return 0;
  }
  map = (Integer *)malloc(GAnproc * 0x70 | 8);
  if (map == (Integer *)0x0) {
    pnga_error("pnga_update44_ghosts:malloc failed (_ga_map)",0);
    IVar10 = GAnproc;
  }
  puVar7 = (ulong *)malloc(IVar10 << 3);
  if (puVar7 == (ulong *)0x0) {
    pnga_error("pnga_update44_ghosts:malloc failed (_ga_proclist)",0);
  }
  lVar1 = local_690;
  pnga_distribution(local_690,proc,lo_loc,hi_loc);
  pnga_proc_topology(lVar1,proc,index);
  lVar1 = local_6c8;
  if (0 < (short)local_6b8) {
    lVar13 = 1;
    lVar31 = 0;
    do {
      lVar13 = lVar13 * ((hi_loc[lVar31] - lo_loc[lVar31]) + width[lVar31] * 2 + 1);
      lVar31 = lVar31 + 1;
    } while (local_6b8 != lVar31);
    if (0 < (short)local_6b8) {
      uVar28 = 1;
      lVar31 = 0;
      do {
        uVar8 = (lVar13 / ((hi_loc[lVar31] - lo_loc[lVar31]) + width[lVar31] * 2 + 1)) *
                width[lVar31];
        if ((long)uVar28 <= (long)uVar8) {
          uVar28 = uVar8;
        }
        lVar31 = lVar31 + 1;
      } while (local_6b8 != lVar31);
      goto LAB_0018cc66;
    }
  }
  uVar28 = 1;
LAB_0018cc66:
  builtin_strncpy(send_name,"send_buffer",0xc);
  builtin_strncpy(rcv_name,"receive_buffer",0xf);
  local_658 = puVar7;
  local_6b0 = (char *)pnga_malloc(uVar28,*(int *)((long)GA->dims + local_6c8 + -0x2c),send_name);
  local_6a8 = uVar28;
  local_6c0 = (char *)pnga_malloc(uVar28,*(int *)((long)GA->dims + lVar1 + -0x2c),rcv_name);
  lVar1 = local_690;
  puVar7 = local_658;
  if (0 < (short)local_6b8) {
    local_6e8 = (int)proc;
    local_660 = (long)local_6e8;
    local_67c = (int)local_6b8 + -1;
    local_6a8 = (ulong)(uint)((int)local_6a8 * (int)local_688);
    lVar31 = 2;
    if (2 < local_6b8) {
      lVar31 = local_6b8;
    }
    local_678 = local_690 * 0x368;
    local_668 = local_678 + 0xd50a8;
    local_670 = local_678 + 0xd4ee0;
    lVar13 = 0;
    local_698 = 0;
    local_5a0 = lVar31 + -1;
    IVar10 = local_6b8;
    do {
      lVar31 = width[lVar13];
      if (lVar31 != 0) {
        get_remote_block_neg(lVar13,IVar10,lo_loc,hi_loc,slo_rcv,shi_rcv,dims,width);
        lVar6 = pnga_locate_region(local_690,slo_rcv,shi_rcv,map,(Integer *)puVar7,&np);
        if (lVar6 == 0) {
          builtin_strncpy(err_string,"cannot locate region: ",0x17);
          strcpy(err_string + 0x16,GA->name + local_6c8);
          sVar9 = strlen(err_string);
          sprintf(err_string + (int)sVar9," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
          sVar9 = strlen(err_string);
          iVar23 = (int)sVar9;
          IVar10 = pnga_ndim(local_690);
          lVar15 = local_690;
          if (1 < IVar10) {
            lVar27 = 1;
            do {
              sprintf(err_string + (int)sVar9,",%ld:%ld ",slo_rcv[lVar27],shi_rcv[lVar27]);
              sVar9 = strlen(err_string);
              iVar23 = (int)sVar9;
              lVar27 = lVar27 + 1;
              IVar10 = pnga_ndim(lVar15);
            } while (lVar27 < IVar10);
          }
          (err_string + iVar23)[0] = ']';
          (err_string + iVar23)[1] = '\0';
          pnga_error(err_string,lVar15);
          puVar7 = local_658;
        }
        lVar27 = local_690;
        uVar28 = *puVar7;
        lVar15 = (long)iVar3 * 5;
        if (-1 < iVar3) {
          uVar28 = (ulong)PGRP_LIST[iVar3].inv_map_proc_list[uVar28];
        }
        lVar11 = 0;
        do {
          if (lVar13 == lVar11) {
            lVar18 = lVar31 + hi_loc[lVar13];
            lVar14 = hi_loc[lVar13] + 1;
          }
          else {
            lVar14 = lo_loc[lVar11];
            lVar18 = hi_loc[lVar11];
          }
          lo_rcv[lVar11] = lVar14;
          hi_rcv[lVar11] = lVar18;
          lVar11 = lVar11 + 1;
        } while (local_6b8 != lVar11);
        lVar11 = 0;
        do {
          if (lVar13 == lVar11) {
            if (dims[lVar13] < hi_rcv[lVar13]) {
              slo_rcv[lVar13] = 1;
              shi_rcv[lVar13] = lVar31;
            }
            else {
              slo_rcv[lVar13] = lo_rcv[lVar13];
              shi_rcv[lVar13] = hi_rcv[lVar13];
            }
          }
          else {
            slo_rcv[lVar11] = lo_rcv[lVar11];
            shi_rcv[lVar11] = hi_rcv[lVar11];
          }
          lVar11 = lVar11 + 1;
        } while (local_6b8 != lVar11);
        lVar6 = pnga_locate_region(local_690,slo_rcv,shi_rcv,map,(Integer *)puVar7,&np);
        __ndim_6 = lVar15;
        if (lVar6 == 0) {
          builtin_strncpy(err_string,"cannot locate region: ",0x17);
          strcpy(err_string + 0x16,GA->name + local_6c8);
          sVar9 = strlen(err_string);
          sprintf(err_string + (int)sVar9," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
          sVar9 = strlen(err_string);
          iVar23 = (int)sVar9;
          IVar10 = pnga_ndim(lVar27);
          lVar15 = local_690;
          if (1 < IVar10) {
            lVar27 = 1;
            do {
              sprintf(err_string + (int)sVar9,",%ld:%ld ",slo_rcv[lVar27],shi_rcv[lVar27]);
              sVar9 = strlen(err_string);
              iVar23 = (int)sVar9;
              lVar27 = lVar27 + 1;
              IVar10 = pnga_ndim(lVar15);
            } while (lVar27 < IVar10);
          }
          (err_string + iVar23)[0] = ']';
          (err_string + iVar23)[1] = '\0';
          pnga_error(err_string,lVar15);
          puVar7 = local_658;
        }
        lVar15 = local_6c8;
        pgVar5 = GA;
        local_6a0 = *puVar7;
        if (-1 < iVar3) {
          local_6a0 = (ulong)(uint)(&PGRP_LIST->inv_map_proc_list)[__ndim_6][local_6a0];
        }
        lVar27 = 0;
        do {
          if (increment[lVar27] == 0) {
            if (lVar13 == lVar27) {
              plo_snd[lVar13] = lVar31;
              phi_snd[lVar13] = lVar31 * 2 + -1;
              plo_rcv[lVar13] = lVar31 + 1 + (hi_loc[lVar13] - lo_loc[lVar13]);
              phi_rcv[lVar13] = (hi_loc[lVar13] - lo_loc[lVar13]) + lVar31 * 2;
            }
            else {
              lVar11 = width[lVar27];
              plo_snd[lVar27] = lVar11;
              lVar18 = (hi_loc[lVar27] - lo_loc[lVar27]) + lVar11;
              phi_snd[lVar27] = lVar18;
              plo_rcv[lVar27] = lVar11;
              phi_rcv[lVar27] = lVar18;
            }
          }
          else {
            plo_rcv[lVar27] = 0;
            lVar11 = (hi_loc[lVar27] - lo_loc[lVar27]) + increment[lVar27];
            phi_rcv[lVar27] = lVar11;
            plo_snd[lVar27] = 0;
            phi_snd[lVar27] = lVar11;
          }
          lVar27 = lVar27 + 1;
        } while (local_6b8 != lVar27);
        uVar2 = *(ushort *)((long)GA->dims + local_6c8 + -0x30);
        uVar8 = (ulong)(short)uVar2;
        iVar23 = *(int *)((long)GA->block_dims + local_6c8 + -4);
        local_64c = iVar23 - 1;
        if (local_64c < 3) {
          lVar31 = *(long *)((long)GA->num_blocks + local_6c8);
          lVar27 = local_660 % lVar31;
          _index[0] = (int)lVar27;
          if (1 < (short)uVar2) {
            lVar11 = 0;
            IVar10 = proc;
            do {
              IVar10 = (long)((int)IVar10 - (int)lVar27) / lVar31;
              lVar31 = *(long *)((long)GA->dims + lVar11 * 8 + local_668 + -0x30);
              lVar27 = (long)(int)IVar10 % lVar31;
              _index[lVar11 + 1] = (int)lVar27;
              lVar11 = lVar11 + 1;
            } while ((uVar8 & 0xffffffff) - 1 != lVar11);
          }
          if (0 < (short)uVar2) {
            lVar31 = 0;
            do {
              iVar17 = *(int *)((long)_index + lVar31);
              lVar27 = *(long *)((long)GA[lVar1 + 1000].block_dims + lVar31 * 2);
              *(long *)(err_string + lVar31 * 2) = lVar27 * iVar17 + 1;
              lVar27 = ((long)iVar17 + 1) * lVar27;
              lVar11 = *(long *)((long)GA[lVar1 + 1000].dims + lVar31 * 2);
              if (lVar11 <= lVar27) {
                lVar27 = lVar11;
              }
              *(long *)((long)_hi + lVar31 * 2) = lVar27;
              lVar31 = lVar31 + 4;
            } while ((uVar8 & 0xffffffff) << 2 != lVar31);
          }
        }
        else if (iVar23 == 4) {
          lVar31 = *(long *)((long)GA->num_blocks + local_6c8);
          lVar27 = local_660 % lVar31;
          _index[0] = (int)lVar27;
          if (1 < (short)uVar2) {
            lVar11 = 0;
            IVar10 = proc;
            do {
              IVar10 = (long)((int)IVar10 - (int)lVar27) / lVar31;
              lVar31 = *(long *)((long)GA->dims + lVar11 * 8 + local_668 + -0x30);
              lVar27 = (long)(int)IVar10 % lVar31;
              _index[lVar11 + 1] = (int)lVar27;
              lVar11 = lVar11 + 1;
            } while ((uVar8 & 0xffffffff) - 1 != lVar11);
          }
          if (0 < (short)uVar2) {
            lVar31 = *(long *)(GA->name + local_6c8 + -8);
            lVar27 = 0;
            iVar17 = 0;
            do {
              iVar29 = *(int *)((long)_index + lVar27);
              lVar18 = (long)iVar17 + (long)iVar29;
              *(undefined8 *)(err_string + lVar27 * 2) = *(undefined8 *)(lVar31 + lVar18 * 8);
              lVar11 = *(long *)((long)GA->num_blocks + lVar27 * 2 + local_6c8);
              if ((long)iVar29 < lVar11 + -1) {
                lVar18 = *(long *)(lVar31 + 8 + lVar18 * 8) + -1;
              }
              else {
                lVar18 = *(long *)((long)GA->dims + lVar27 * 2 + local_6c8);
              }
              *(long *)((long)_hi + lVar27 * 2) = lVar18;
              iVar17 = iVar17 + (int)lVar11;
              lVar27 = lVar27 + 4;
            } while ((uVar8 & 0xffffffff) << 2 != lVar27);
          }
        }
        else if (iVar23 == 0) {
          lVar31 = *(long *)((long)GA->old_nblock + local_6c8 + -0x30);
          if (lVar31 == 0) {
            if (0 < (short)uVar2) {
              lVar31 = 1;
              uVar21 = 0;
              do {
                lVar31 = lVar31 * *(int *)((long)GA->dims + uVar21 * 4 + local_670 + -0x30);
                uVar21 = uVar21 + 1;
              } while (uVar8 != uVar21);
              if ((proc < 0) || (lVar31 <= proc)) goto LAB_0018d656;
              if (0 < (short)uVar2) {
                lVar31 = *(long *)(GA->name + local_6c8 + -8);
                uVar21 = 0;
                lVar27 = 0;
                IVar10 = proc;
                do {
                  lVar18 = (long)*(int *)((long)GA[1000].nblock + uVar21 * 4 + local_678);
                  lVar11 = lVar31 + (IVar10 % lVar18) * 8;
                  hi_loc[uVar21 - 0x20] = *(Integer *)(lVar11 + lVar27 * 8);
                  if (IVar10 % lVar18 == lVar18 + -1) {
                    lVar11 = *(long *)((long)GA[1000].dims + uVar21 * 8 + local_678);
                  }
                  else {
                    lVar11 = *(long *)(lVar11 + 8 + lVar27 * 8) + -1;
                  }
                  lVar27 = lVar27 + lVar18;
                  _hi[uVar21] = lVar11;
                  uVar21 = uVar21 + 1;
                  IVar10 = IVar10 / lVar18;
                } while (uVar8 != uVar21);
              }
            }
          }
          else if (proc < lVar31) {
            if (0 < (short)uVar2) {
              lVar31 = 1;
              uVar21 = 0;
              do {
                lVar31 = lVar31 * *(int *)((long)GA->dims + uVar21 * 4 + local_670 + -0x30);
                uVar21 = uVar21 + 1;
              } while (uVar8 != uVar21);
              if ((proc < 0) || (lVar31 <= proc)) goto LAB_0018d656;
              if (0 < (short)uVar2) {
                lVar31 = *(long *)(GA->name + local_6c8 + -8);
                uVar21 = 0;
                lVar27 = 0;
                IVar10 = proc;
                do {
                  lVar18 = (long)*(int *)((long)GA[1000].nblock + uVar21 * 4 + local_678);
                  lVar11 = lVar31 + (IVar10 % lVar18) * 8;
                  hi_loc[uVar21 - 0x20] = *(Integer *)(lVar11 + lVar27 * 8);
                  if (IVar10 % lVar18 == lVar18 + -1) {
                    lVar11 = *(long *)((long)GA[1000].dims + uVar21 * 8 + local_678);
                  }
                  else {
                    lVar11 = *(long *)(lVar11 + 8 + lVar27 * 8) + -1;
                  }
                  lVar27 = lVar27 + lVar18;
                  _hi[uVar21] = lVar11;
                  uVar21 = uVar21 + 1;
                  IVar10 = IVar10 / lVar18;
                } while (uVar8 != uVar21);
              }
            }
          }
          else {
LAB_0018d656:
            if (0 < (short)uVar2) {
              memset(err_string,0,uVar8 * 8);
              memset(_hi,0xff,uVar8 * 8);
            }
          }
        }
        if (uVar8 == 1) {
          ld_loc[0] = (_hi[0] - err_string._0_8_) + *(long *)((long)pgVar5->width + local_6c8) * 2 +
                      1;
        }
        if ((short)uVar2 < 2) {
          lVar31 = 1;
          lVar27 = 0;
        }
        else {
          lVar31 = 1;
          lVar11 = 0;
          lVar27 = 0;
          do {
            lVar27 = lVar27 + plo_snd[lVar11] * lVar31;
            lVar18 = (_hi[lVar11] - hi_loc[lVar11 + -0x20]) + pgVar5[lVar1 + 1000].width[lVar11] * 2
                     + 1;
            ld_loc[lVar11] = lVar18;
            lVar31 = lVar31 * lVar18;
            lVar11 = lVar11 + 1;
          } while (uVar8 - 1 != lVar11);
        }
        lVar11 = plo_snd[uVar8 - 1];
        lVar18 = *(long *)(*(long *)(pgVar5->name + lVar15 + -0x10) + proc * 8);
        lVar14 = (long)*(int *)((long)pgVar5->dims + lVar15 + -0x18);
        if (local_64c < 3) {
          lVar15 = *(long *)((long)pgVar5->num_blocks + lVar15);
          lVar19 = local_660 % lVar15;
          _index[0] = (int)lVar19;
          if (1 < (short)uVar2) {
            lVar25 = 0;
            IVar10 = proc;
            do {
              IVar10 = (long)((int)IVar10 - (int)lVar19) / lVar15;
              lVar15 = *(long *)((long)pgVar5->dims + lVar25 * 8 + local_668 + -0x30);
              lVar19 = (long)(int)IVar10 % lVar15;
              _index[lVar25 + 1] = (int)lVar19;
              lVar25 = lVar25 + 1;
            } while ((uVar8 & 0xffffffff) - 1 != lVar25);
          }
          if (0 < (short)uVar2) {
            lVar15 = 0;
            do {
              iVar23 = *(int *)((long)_index + lVar15);
              lVar19 = *(long *)((long)pgVar5[lVar1 + 1000].block_dims + lVar15 * 2);
              *(long *)(err_string + lVar15 * 2) = lVar19 * iVar23 + 1;
              lVar19 = ((long)iVar23 + 1) * lVar19;
              lVar25 = *(long *)((long)pgVar5[lVar1 + 1000].dims + lVar15 * 2);
              if (lVar25 <= lVar19) {
                lVar19 = lVar25;
              }
              *(long *)((long)_hi + lVar15 * 2) = lVar19;
              lVar15 = lVar15 + 4;
            } while ((uVar8 & 0xffffffff) << 2 != lVar15);
          }
        }
        else if (iVar23 == 4) {
          lVar19 = *(long *)((long)pgVar5->num_blocks + lVar15);
          lVar25 = local_660 % lVar19;
          _index[0] = (int)lVar25;
          if (1 < (short)uVar2) {
            lVar20 = 0;
            IVar10 = proc;
            do {
              IVar10 = (long)((int)IVar10 - (int)lVar25) / lVar19;
              lVar19 = *(long *)((long)pgVar5->dims + lVar20 * 8 + local_668 + -0x30);
              lVar25 = (long)(int)IVar10 % lVar19;
              _index[lVar20 + 1] = (int)lVar25;
              lVar20 = lVar20 + 1;
            } while ((uVar8 & 0xffffffff) - 1 != lVar20);
          }
          if (0 < (short)uVar2) {
            lVar19 = *(long *)(pgVar5->name + local_6c8 + -8);
            lVar25 = 0;
            iVar23 = 0;
            do {
              iVar17 = *(int *)((long)_index + lVar25);
              lVar30 = (long)iVar23 + (long)iVar17;
              *(undefined8 *)(err_string + lVar25 * 2) = *(undefined8 *)(lVar19 + lVar30 * 8);
              lVar20 = *(long *)((long)pgVar5->num_blocks + lVar25 * 2 + lVar15);
              if ((long)iVar17 < lVar20 + -1) {
                lVar30 = *(long *)(lVar19 + 8 + lVar30 * 8) + -1;
              }
              else {
                lVar30 = *(long *)((long)pgVar5->dims + lVar25 * 2 + lVar15);
              }
              *(long *)((long)_hi + lVar25 * 2) = lVar30;
              iVar23 = iVar23 + (int)lVar20;
              lVar25 = lVar25 + 4;
            } while ((uVar8 & 0xffffffff) << 2 != lVar25);
          }
        }
        else if (iVar23 == 0) {
          lVar19 = *(long *)((long)pgVar5->old_nblock + lVar15 + -0x30);
          if (lVar19 == 0) {
            if (0 < (short)uVar2) {
              lVar19 = 1;
              uVar21 = 0;
              do {
                lVar19 = lVar19 * *(int *)((long)pgVar5->dims + uVar21 * 4 + local_670 + -0x30);
                uVar21 = uVar21 + 1;
              } while (uVar8 != uVar21);
              if ((proc < 0) || (lVar19 <= proc)) {
LAB_0018daf0:
                uVar21 = uVar8;
                if (0 < (short)uVar2) goto LAB_0018dafd;
              }
              else if (0 < (short)uVar2) {
                lVar15 = *(long *)(pgVar5->name + lVar15 + -8);
                lVar19 = 0;
                uVar21 = 0;
                IVar10 = proc;
                do {
                  lVar20 = (long)*(int *)((long)pgVar5[1000].nblock + uVar21 * 4 + local_678);
                  lVar25 = lVar15 + (IVar10 % lVar20) * 8;
                  hi_loc[uVar21 - 0x20] = *(Integer *)(lVar25 + lVar19 * 8);
                  if (IVar10 % lVar20 == lVar20 + -1) {
                    lVar25 = *(long *)((long)pgVar5[1000].dims + uVar21 * 8 + local_678);
                  }
                  else {
                    lVar25 = *(long *)(lVar25 + 8 + lVar19 * 8) + -1;
                  }
                  lVar19 = lVar19 + lVar20;
                  _hi[uVar21] = lVar25;
                  uVar21 = uVar21 + 1;
                  IVar10 = IVar10 / lVar20;
                } while (uVar8 != uVar21);
              }
            }
          }
          else if (proc < lVar19) {
            if (0 < (short)uVar2) {
              lVar19 = 1;
              uVar21 = 0;
              do {
                lVar19 = lVar19 * *(int *)((long)pgVar5->dims + uVar21 * 4 + local_670 + -0x30);
                uVar21 = uVar21 + 1;
              } while (uVar8 != uVar21);
              if ((proc < 0) || (lVar19 <= proc)) goto LAB_0018daf0;
              if (0 < (short)uVar2) {
                lVar15 = *(long *)(pgVar5->name + lVar15 + -8);
                lVar19 = 0;
                uVar21 = 0;
                IVar10 = proc;
                do {
                  lVar20 = (long)*(int *)((long)pgVar5[1000].nblock + uVar21 * 4 + local_678);
                  lVar25 = lVar15 + (IVar10 % lVar20) * 8;
                  hi_loc[uVar21 - 0x20] = *(Integer *)(lVar25 + lVar19 * 8);
                  if (IVar10 % lVar20 == lVar20 + -1) {
                    lVar25 = *(long *)((long)pgVar5[1000].dims + uVar21 * 8 + local_678);
                  }
                  else {
                    lVar25 = *(long *)(lVar25 + 8 + lVar19 * 8) + -1;
                  }
                  lVar19 = lVar19 + lVar20;
                  _hi[uVar21] = lVar25;
                  uVar21 = uVar21 + 1;
                  IVar10 = IVar10 / lVar20;
                } while (uVar8 != uVar21);
              }
            }
          }
          else if (0 < (short)uVar2) {
            uVar21 = (ulong)uVar2;
LAB_0018dafd:
            memset(err_string,0,uVar21 << 3);
            memset(_hi,0xff,uVar21 << 3);
          }
        }
        pcVar22 = local_6b0;
        if (uVar8 == 1) {
          ld_loc[0] = (_hi[0] - err_string._0_8_) + *(long *)((long)pgVar5->width + local_6c8) * 2 +
                      1;
        }
        if ((short)uVar2 < 2) {
          lVar19 = 1;
          lVar15 = 0;
        }
        else {
          lVar19 = 1;
          lVar15 = 0;
          lVar25 = 0;
          do {
            lVar15 = lVar15 + plo_rcv[lVar25] * lVar19;
            lVar20 = (_hi[lVar25] - hi_loc[lVar25 + -0x20]) + pgVar5[lVar1 + 1000].width[lVar25] * 2
                     + 1;
            ld_loc[lVar25] = lVar20;
            lVar19 = lVar19 * lVar20;
            lVar25 = lVar25 + 1;
          } while (uVar8 - 1 != lVar25);
        }
        lVar25 = plo_rcv[uVar8 - 1];
        iVar23 = (int)local_688;
        stride_snd[0] = iVar23;
        stride_rcv[0] = iVar23;
        if ((short)local_6b8 != 1) {
          uVar21 = local_688 & 0xffffffff;
          lVar20 = 0;
          uVar8 = local_688;
          do {
            IVar10 = ld_loc[lVar20];
            uVar16 = (int)uVar8 * (int)IVar10;
            uVar8 = (ulong)uVar16;
            stride_rcv[lVar20] = uVar16;
            uVar12 = (int)uVar21 * (int)IVar10;
            uVar21 = (ulong)uVar12;
            stride_snd[lVar20] = uVar12;
            stride_rcv[lVar20 + 1] = uVar16;
            stride_snd[lVar20 + 1] = uVar12;
            lVar20 = lVar20 + 1;
          } while (local_5a0 != lVar20);
        }
        lVar20 = 0;
        do {
          count[lVar20] = ((int)phi_rcv[lVar20] - (int)plo_rcv[lVar20]) + 1;
          lVar20 = lVar20 + 1;
        } while (local_6b8 != lVar20);
        lVar30 = 1;
        lVar20 = 0;
        do {
          lVar30 = lVar30 * ((phi_snd[lVar20] - plo_snd[lVar20]) + 1);
          lVar20 = lVar20 + 1;
        } while (local_6b8 != lVar20);
        count[0] = count[0] * iVar23;
        armci_write_strided((void *)((lVar31 * lVar11 + lVar27) * lVar14 + lVar18),local_67c,
                            stride_snd,count,local_6b0);
        lVar31 = local_690;
        if (GAme != uVar28) {
          iVar29 = (int)lVar30 * (int)local_688;
          uVar8 = (ulong)*(int *)((long)GA->nblock + lVar13 * 4 + local_6c8);
          iVar23 = (int)uVar28;
          iVar17 = (int)local_698;
          if ((uVar8 & 1) == 0) {
            if ((*(byte *)(index + lVar13) & 1) == 0) {
              armci_msg_rcv(iVar17,local_6c0,(int)local_6a8,&msglen,(int)local_6a0);
            }
            else {
              armci_msg_snd(iVar17,local_6b0,iVar29,iVar23);
            }
            if ((*(byte *)(index + lVar13) & 1) == 0) {
              armci_msg_snd((int)local_698,local_6b0,iVar29,iVar23);
              pcVar22 = local_6c0;
              goto LAB_0018de5f;
            }
          }
          else {
            uVar8 = uVar8 - 1;
            if ((index[lVar13] & 1U) == 0) {
              uVar28 = uVar8;
              if (index[lVar13] != uVar8) {
                armci_msg_rcv(iVar17,local_6c0,(int)local_6a8,&msglen,(int)local_6a0);
                goto LAB_0018ddc3;
              }
            }
            else {
              armci_msg_snd(iVar17,local_6b0,iVar29,iVar23);
LAB_0018ddc3:
              uVar28 = index[lVar13];
            }
            if ((uVar28 & 1) == 0) {
              if (uVar28 != 0) {
                armci_msg_snd((int)local_698,local_6b0,iVar29,iVar23);
              }
            }
            else {
              armci_msg_rcv((int)local_698,local_6c0,(int)local_6a8,&msglen,(int)local_6a0);
            }
            uVar28 = index[lVar13];
            if (uVar28 == 0) {
              armci_msg_snd((int)local_698,local_6b0,iVar29,iVar23);
              uVar28 = index[lVar13];
            }
            pcVar22 = local_6c0;
            if (uVar28 != uVar8) goto LAB_0018de5f;
          }
          pcVar22 = local_6c0;
          armci_msg_rcv((int)local_698,local_6c0,(int)local_6a8,&msglen,(int)local_6a0);
        }
LAB_0018de5f:
        armci_read_strided((void *)((lVar19 * lVar25 + lVar15) * lVar14 + lVar18),local_67c,
                           stride_rcv,count,pcVar22);
        get_remote_block_pos(lVar13,local_6b8,lo_loc,hi_loc,slo_rcv,shi_rcv,dims,width);
        puVar7 = local_658;
        lVar6 = pnga_locate_region(lVar31,slo_rcv,shi_rcv,map,(Integer *)local_658,&np);
        if (lVar6 == 0) {
          builtin_strncpy(err_string,"cannot locate region: ",0x17);
          strcpy(err_string + 0x16,GA->name + local_6c8);
          sVar9 = strlen(err_string);
          sprintf(err_string + (int)sVar9," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
          sVar9 = strlen(err_string);
          iVar23 = (int)sVar9;
          IVar10 = pnga_ndim(lVar31);
          if (1 < IVar10) {
            lVar15 = 1;
            do {
              sprintf(err_string + (int)sVar9,",%ld:%ld ",slo_rcv[lVar15],shi_rcv[lVar15]);
              sVar9 = strlen(err_string);
              iVar23 = (int)sVar9;
              lVar15 = lVar15 + 1;
              IVar10 = pnga_ndim(lVar31);
            } while (lVar15 < IVar10);
          }
          (err_string + iVar23)[0] = ']';
          (err_string + iVar23)[1] = '\0';
          pnga_error(err_string,lVar31);
          puVar7 = local_658;
        }
        lVar15 = __ndim_6;
        local_6a0 = *puVar7;
        if (-1 < iVar3) {
          local_6a0 = (ulong)(uint)(&PGRP_LIST->inv_map_proc_list)[__ndim_6][local_6a0];
        }
        iVar23 = (int)local_698 + 1;
        lVar27 = 0;
        do {
          if (lVar13 == lVar27) {
            lVar11 = lo_loc[lVar13] - width[lVar13];
            lVar18 = lo_loc[lVar13] + -1;
          }
          else {
            lVar11 = lo_loc[lVar27];
            lVar18 = hi_loc[lVar27];
          }
          lo_rcv[lVar27] = lVar11;
          hi_rcv[lVar27] = lVar18;
          lVar27 = lVar27 + 1;
        } while (local_6b8 != lVar27);
        lVar27 = 0;
        do {
          if (lVar13 == lVar27) {
            if (hi_rcv[lVar13] < 1) {
              shi_rcv[lVar13] = dims[lVar13];
              slo_rcv[lVar13] = (dims[lVar13] - width[lVar13]) + 1;
            }
            else {
              slo_rcv[lVar13] = lo_rcv[lVar13];
              shi_rcv[lVar13] = hi_rcv[lVar13];
            }
          }
          else {
            slo_rcv[lVar27] = lo_rcv[lVar27];
            shi_rcv[lVar27] = hi_rcv[lVar27];
          }
          lVar27 = lVar27 + 1;
        } while (local_6b8 != lVar27);
        lVar6 = pnga_locate_region(lVar31,slo_rcv,shi_rcv,map,(Integer *)puVar7,&np);
        if (lVar6 == 0) {
          builtin_strncpy(err_string,"cannot locate region: ",0x17);
          strcpy(err_string + 0x16,GA->name + local_6c8);
          sVar9 = strlen(err_string);
          sprintf(err_string + (int)sVar9," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
          sVar9 = strlen(err_string);
          iVar17 = (int)sVar9;
          IVar10 = pnga_ndim(lVar31);
          if (1 < IVar10) {
            lVar15 = 1;
            do {
              sprintf(err_string + (int)sVar9,",%ld:%ld ",slo_rcv[lVar15],shi_rcv[lVar15]);
              sVar9 = strlen(err_string);
              iVar17 = (int)sVar9;
              lVar15 = lVar15 + 1;
              IVar10 = pnga_ndim(lVar31);
            } while (lVar15 < IVar10);
          }
          (err_string + iVar17)[0] = ']';
          (err_string + iVar17)[1] = '\0';
          pnga_error(err_string,lVar31);
          lVar15 = __ndim_6;
          puVar7 = local_658;
        }
        lVar31 = local_6c8;
        pgVar5 = GA;
        uVar28 = *puVar7;
        if (-1 < iVar3) {
          uVar28 = (ulong)(&PGRP_LIST->inv_map_proc_list)[lVar15][uVar28];
        }
        lVar15 = 0;
        do {
          if (increment[lVar15] == 0) {
            if (lVar13 == lVar15) {
              plo_snd[lVar13] = (hi_loc[lVar13] - lo_loc[lVar13]) + 1;
              phi_snd[lVar13] = (hi_loc[lVar13] - lo_loc[lVar13]) + width[lVar13];
              plo_rcv[lVar13] = 0;
              phi_rcv[lVar13] = width[lVar13] + -1;
            }
            else {
              lVar27 = width[lVar15];
              plo_snd[lVar15] = lVar27;
              lVar11 = (hi_loc[lVar15] - lo_loc[lVar15]) + lVar27;
              phi_snd[lVar15] = lVar11;
              plo_rcv[lVar15] = lVar27;
              phi_rcv[lVar15] = lVar11;
            }
          }
          else {
            plo_rcv[lVar15] = 0;
            lVar27 = (hi_loc[lVar15] - lo_loc[lVar15]) + increment[lVar15];
            phi_rcv[lVar15] = lVar27;
            plo_snd[lVar15] = 0;
            phi_snd[lVar15] = lVar27;
          }
          lVar15 = lVar15 + 1;
        } while (local_6b8 != lVar15);
        sVar26 = *(short *)((long)GA->dims + local_6c8 + -0x30);
        __ndim_6 = (ulong)sVar26;
        iVar17 = *(int *)((long)GA->block_dims + local_6c8 + -4);
        local_64c = iVar17 - 1;
        if (local_64c < 3) {
          lVar15 = *(long *)((long)GA->num_blocks + local_6c8);
          lVar27 = local_660 % lVar15;
          _index[0] = (int)lVar27;
          if (1 < sVar26) {
            lVar11 = 0;
            IVar10 = proc;
            do {
              IVar10 = (long)((int)IVar10 - (int)lVar27) / lVar15;
              lVar15 = *(long *)((long)GA->dims + lVar11 * 8 + local_668 + -0x30);
              lVar27 = (long)(int)IVar10 % lVar15;
              _index[lVar11 + 1] = (int)lVar27;
              lVar11 = lVar11 + 1;
            } while ((__ndim_6 & 0xffffffff) - 1 != lVar11);
          }
          if (0 < sVar26) {
            lVar15 = 0;
            do {
              iVar29 = *(int *)((long)_index + lVar15);
              lVar27 = *(long *)((long)GA[lVar1 + 1000].block_dims + lVar15 * 2);
              *(long *)(err_string + lVar15 * 2) = lVar27 * iVar29 + 1;
              lVar27 = ((long)iVar29 + 1) * lVar27;
              lVar11 = *(long *)((long)GA[lVar1 + 1000].dims + lVar15 * 2);
              if (lVar11 <= lVar27) {
                lVar27 = lVar11;
              }
              *(long *)((long)_hi + lVar15 * 2) = lVar27;
              lVar15 = lVar15 + 4;
            } while ((__ndim_6 & 0xffffffff) << 2 != lVar15);
          }
        }
        else if (iVar17 == 4) {
          lVar15 = *(long *)((long)GA->num_blocks + local_6c8);
          lVar27 = local_660 % lVar15;
          _index[0] = (int)lVar27;
          if (1 < sVar26) {
            lVar11 = 0;
            IVar10 = proc;
            do {
              IVar10 = (long)((int)IVar10 - (int)lVar27) / lVar15;
              lVar15 = *(long *)((long)GA->dims + lVar11 * 8 + local_668 + -0x30);
              lVar27 = (long)(int)IVar10 % lVar15;
              _index[lVar11 + 1] = (int)lVar27;
              lVar11 = lVar11 + 1;
            } while ((__ndim_6 & 0xffffffff) - 1 != lVar11);
          }
          if (0 < sVar26) {
            lVar15 = *(long *)(GA->name + local_6c8 + -8);
            lVar27 = 0;
            iVar29 = 0;
            do {
              iVar4 = *(int *)((long)_index + lVar27);
              lVar18 = (long)iVar29 + (long)iVar4;
              *(undefined8 *)(err_string + lVar27 * 2) = *(undefined8 *)(lVar15 + lVar18 * 8);
              lVar11 = *(long *)((long)GA->num_blocks + lVar27 * 2 + local_6c8);
              if ((long)iVar4 < lVar11 + -1) {
                lVar18 = *(long *)(lVar15 + 8 + lVar18 * 8) + -1;
              }
              else {
                lVar18 = *(long *)((long)GA->dims + lVar27 * 2 + local_6c8);
              }
              *(long *)((long)_hi + lVar27 * 2) = lVar18;
              iVar29 = iVar29 + (int)lVar11;
              lVar27 = lVar27 + 4;
            } while ((__ndim_6 & 0xffffffff) << 2 != lVar27);
          }
        }
        else if (iVar17 == 0) {
          lVar15 = *(long *)((long)GA->old_nblock + local_6c8 + -0x30);
          if (lVar15 == 0) {
            if (0 < sVar26) {
              lVar15 = 1;
              uVar8 = 0;
              do {
                lVar15 = lVar15 * *(int *)((long)GA->dims + uVar8 * 4 + local_670 + -0x30);
                uVar8 = uVar8 + 1;
              } while (__ndim_6 != uVar8);
              if ((proc < 0) || (lVar15 <= proc)) goto LAB_0018e726;
              if (0 < sVar26) {
                lVar15 = *(long *)(GA->name + local_6c8 + -8);
                lVar27 = 0;
                uVar8 = 0;
                IVar10 = proc;
                do {
                  lVar18 = (long)*(int *)((long)GA[1000].nblock + uVar8 * 4 + local_678);
                  lVar11 = lVar15 + (IVar10 % lVar18) * 8;
                  hi_loc[uVar8 - 0x20] = *(Integer *)(lVar11 + lVar27 * 8);
                  if (IVar10 % lVar18 == lVar18 + -1) {
                    lVar11 = *(long *)((long)GA[1000].dims + uVar8 * 8 + local_678);
                  }
                  else {
                    lVar11 = *(long *)(lVar11 + 8 + lVar27 * 8) + -1;
                  }
                  lVar27 = lVar27 + lVar18;
                  _hi[uVar8] = lVar11;
                  uVar8 = uVar8 + 1;
                  IVar10 = IVar10 / lVar18;
                } while (__ndim_6 != uVar8);
              }
            }
          }
          else if (proc < lVar15) {
            if (0 < sVar26) {
              lVar15 = 1;
              uVar8 = 0;
              do {
                lVar15 = lVar15 * *(int *)((long)GA->dims + uVar8 * 4 + local_670 + -0x30);
                uVar8 = uVar8 + 1;
              } while (__ndim_6 != uVar8);
              if ((proc < 0) || (lVar15 <= proc)) goto LAB_0018e726;
              if (0 < sVar26) {
                lVar15 = *(long *)(GA->name + local_6c8 + -8);
                lVar27 = 0;
                uVar8 = 0;
                IVar10 = proc;
                do {
                  lVar18 = (long)*(int *)((long)GA[1000].nblock + uVar8 * 4 + local_678);
                  lVar11 = lVar15 + (IVar10 % lVar18) * 8;
                  hi_loc[uVar8 - 0x20] = *(Integer *)(lVar11 + lVar27 * 8);
                  if (IVar10 % lVar18 == lVar18 + -1) {
                    lVar11 = *(long *)((long)GA[1000].dims + uVar8 * 8 + local_678);
                  }
                  else {
                    lVar11 = *(long *)(lVar11 + 8 + lVar27 * 8) + -1;
                  }
                  lVar27 = lVar27 + lVar18;
                  _hi[uVar8] = lVar11;
                  uVar8 = uVar8 + 1;
                  IVar10 = IVar10 / lVar18;
                } while (__ndim_6 != uVar8);
              }
            }
          }
          else {
LAB_0018e726:
            if (0 < sVar26) {
              sVar9 = __ndim_6 * 8;
              memset(err_string,0,sVar9);
              memset(_hi,0xff,sVar9);
            }
          }
        }
        uVar8 = __ndim_6;
        lVar15 = __ndim_6 - 1;
        if (__ndim_6 == 1) {
          ld_loc[0] = (_hi[0] - err_string._0_8_) + *(long *)((long)pgVar5->width + local_6c8) * 2 +
                      1;
        }
        sVar26 = (short)__ndim_6;
        if (sVar26 < 2) {
          lVar27 = 1;
          lVar11 = 0;
        }
        else {
          lVar27 = 1;
          lVar11 = 0;
          lVar18 = 0;
          do {
            lVar11 = lVar11 + plo_snd[lVar18] * lVar27;
            lVar14 = (_hi[lVar18] - hi_loc[lVar18 + -0x20]) + pgVar5[lVar1 + 1000].width[lVar18] * 2
                     + 1;
            ld_loc[lVar18] = lVar14;
            lVar27 = lVar27 * lVar14;
            lVar18 = lVar18 + 1;
          } while (lVar15 != lVar18);
        }
        lVar18 = plo_snd[__ndim_6 - 1];
        lVar14 = *(long *)(*(long *)(pgVar5->name + lVar31 + -0x10) + proc * 8);
        lVar19 = (long)*(int *)((long)pgVar5->dims + lVar31 + -0x18);
        if (local_64c < 3) {
          lVar31 = *(long *)((long)pgVar5->num_blocks + lVar31);
          lVar25 = local_660 % lVar31;
          _index[0] = (int)lVar25;
          if (1 < sVar26) {
            lVar20 = 0;
            IVar10 = proc;
            do {
              IVar10 = (long)((int)IVar10 - (int)lVar25) / lVar31;
              lVar31 = *(long *)((long)pgVar5->dims + lVar20 * 8 + local_668 + -0x30);
              lVar25 = (long)(int)IVar10 % lVar31;
              _index[lVar20 + 1] = (int)lVar25;
              lVar20 = lVar20 + 1;
            } while ((__ndim_6 & 0xffffffff) - 1 != lVar20);
          }
          if (0 < sVar26) {
            lVar31 = 0;
            do {
              iVar17 = *(int *)((long)_index + lVar31);
              lVar25 = *(long *)((long)pgVar5[lVar1 + 1000].block_dims + lVar31 * 2);
              *(long *)(err_string + lVar31 * 2) = lVar25 * iVar17 + 1;
              lVar25 = ((long)iVar17 + 1) * lVar25;
              lVar20 = *(long *)((long)pgVar5[lVar1 + 1000].dims + lVar31 * 2);
              if (lVar20 <= lVar25) {
                lVar25 = lVar20;
              }
              *(long *)((long)_hi + lVar31 * 2) = lVar25;
              lVar31 = lVar31 + 4;
            } while ((__ndim_6 & 0xffffffff) << 2 != lVar31);
          }
        }
        else if (iVar17 == 4) {
          lVar25 = *(long *)((long)pgVar5->num_blocks + lVar31);
          lVar20 = local_660 % lVar25;
          _index[0] = (int)lVar20;
          if (1 < sVar26) {
            lVar30 = 0;
            IVar10 = proc;
            do {
              IVar10 = (long)((int)IVar10 - (int)lVar20) / lVar25;
              lVar25 = *(long *)((long)pgVar5->dims + lVar30 * 8 + local_668 + -0x30);
              lVar20 = (long)(int)IVar10 % lVar25;
              _index[lVar30 + 1] = (int)lVar20;
              lVar30 = lVar30 + 1;
            } while ((__ndim_6 & 0xffffffff) - 1 != lVar30);
          }
          if (0 < sVar26) {
            lVar25 = *(long *)(pgVar5->name + local_6c8 + -8);
            lVar20 = 0;
            iVar17 = 0;
            do {
              iVar29 = *(int *)((long)_index + lVar20);
              lVar24 = (long)iVar17 + (long)iVar29;
              *(undefined8 *)(err_string + lVar20 * 2) = *(undefined8 *)(lVar25 + lVar24 * 8);
              lVar30 = *(long *)((long)pgVar5->num_blocks + lVar20 * 2 + lVar31);
              if ((long)iVar29 < lVar30 + -1) {
                lVar24 = *(long *)(lVar25 + 8 + lVar24 * 8) + -1;
              }
              else {
                lVar24 = *(long *)((long)pgVar5->dims + lVar20 * 2 + lVar31);
              }
              *(long *)((long)_hi + lVar20 * 2) = lVar24;
              iVar17 = iVar17 + (int)lVar30;
              lVar20 = lVar20 + 4;
            } while ((__ndim_6 & 0xffffffff) << 2 != lVar20);
          }
        }
        else if (iVar17 == 0) {
          lVar25 = *(long *)((long)pgVar5->old_nblock + lVar31 + -0x30);
          if (lVar25 == 0) {
            if (0 < sVar26) {
              lVar25 = 1;
              uVar21 = 0;
              do {
                lVar25 = lVar25 * *(int *)((long)pgVar5->dims + uVar21 * 4 + local_670 + -0x30);
                uVar21 = uVar21 + 1;
              } while (__ndim_6 != uVar21);
              if ((proc < 0) || (lVar25 <= proc)) {
LAB_0018ebc0:
                if (0 < sVar26) {
                  sVar9 = __ndim_6 << 3;
                  goto LAB_0018ebcd;
                }
              }
              else if (0 < sVar26) {
                lVar31 = *(long *)(pgVar5->name + lVar31 + -8);
                lVar25 = 0;
                uVar21 = 0;
                IVar10 = proc;
                do {
                  lVar30 = (long)*(int *)((long)pgVar5[1000].nblock + uVar21 * 4 + local_678);
                  lVar20 = lVar31 + (IVar10 % lVar30) * 8;
                  hi_loc[uVar21 - 0x20] = *(Integer *)(lVar20 + lVar25 * 8);
                  if (IVar10 % lVar30 == lVar30 + -1) {
                    lVar20 = *(long *)((long)pgVar5[1000].dims + uVar21 * 8 + local_678);
                  }
                  else {
                    lVar20 = *(long *)(lVar20 + 8 + lVar25 * 8) + -1;
                  }
                  lVar25 = lVar25 + lVar30;
                  _hi[uVar21] = lVar20;
                  uVar21 = uVar21 + 1;
                  IVar10 = IVar10 / lVar30;
                } while (__ndim_6 != uVar21);
              }
            }
          }
          else if (proc < lVar25) {
            if (0 < sVar26) {
              lVar25 = 1;
              uVar21 = 0;
              do {
                lVar25 = lVar25 * *(int *)((long)pgVar5->dims + uVar21 * 4 + local_670 + -0x30);
                uVar21 = uVar21 + 1;
              } while (__ndim_6 != uVar21);
              if ((proc < 0) || (lVar25 <= proc)) goto LAB_0018ebc0;
              if (0 < sVar26) {
                lVar31 = *(long *)(pgVar5->name + lVar31 + -8);
                lVar25 = 0;
                uVar21 = 0;
                IVar10 = proc;
                do {
                  lVar30 = (long)*(int *)((long)pgVar5[1000].nblock + uVar21 * 4 + local_678);
                  lVar20 = lVar31 + (IVar10 % lVar30) * 8;
                  hi_loc[uVar21 - 0x20] = *(Integer *)(lVar20 + lVar25 * 8);
                  if (IVar10 % lVar30 == lVar30 + -1) {
                    lVar20 = *(long *)((long)pgVar5[1000].dims + uVar21 * 8 + local_678);
                  }
                  else {
                    lVar20 = *(long *)(lVar20 + 8 + lVar25 * 8) + -1;
                  }
                  lVar25 = lVar25 + lVar30;
                  _hi[uVar21] = lVar20;
                  uVar21 = uVar21 + 1;
                  IVar10 = IVar10 / lVar30;
                } while (__ndim_6 != uVar21);
              }
            }
          }
          else if (0 < sVar26) {
            sVar9 = (size_t)(((uint)__ndim_6 & 0xffff) << 3);
LAB_0018ebcd:
            memset(err_string,0,sVar9);
            memset(_hi,0xff,sVar9);
          }
        }
        pcVar22 = local_6b0;
        if (uVar8 == 1) {
          ld_loc[0] = (_hi[0] - err_string._0_8_) + *(long *)((long)pgVar5->width + local_6c8) * 2 +
                      1;
        }
        if ((short)__ndim_6 < 2) {
          lVar25 = 1;
          lVar31 = 0;
        }
        else {
          lVar25 = 1;
          lVar31 = 0;
          lVar20 = 0;
          do {
            lVar31 = lVar31 + plo_rcv[lVar20] * lVar25;
            lVar30 = (_hi[lVar20] - hi_loc[lVar20 + -0x20]) + pgVar5[lVar1 + 1000].width[lVar20] * 2
                     + 1;
            ld_loc[lVar20] = lVar30;
            lVar25 = lVar25 * lVar30;
            lVar20 = lVar20 + 1;
          } while (lVar15 != lVar20);
        }
        lVar15 = plo_rcv[__ndim_6 - 1];
        iVar17 = (int)local_688;
        stride_snd[0] = iVar17;
        stride_rcv[0] = iVar17;
        if ((short)local_6b8 != 1) {
          uVar21 = local_688 & 0xffffffff;
          lVar20 = 0;
          uVar8 = local_688;
          do {
            IVar10 = ld_loc[lVar20];
            uVar16 = (int)uVar8 * (int)IVar10;
            uVar8 = (ulong)uVar16;
            stride_rcv[lVar20] = uVar16;
            uVar12 = (int)uVar21 * (int)IVar10;
            uVar21 = (ulong)uVar12;
            stride_snd[lVar20] = uVar12;
            stride_rcv[lVar20 + 1] = uVar16;
            stride_snd[lVar20 + 1] = uVar12;
            lVar20 = lVar20 + 1;
          } while (local_5a0 != lVar20);
        }
        lVar20 = 0;
        do {
          count[lVar20] = ((int)phi_rcv[lVar20] - (int)plo_rcv[lVar20]) + 1;
          lVar20 = lVar20 + 1;
        } while (local_6b8 != lVar20);
        lVar30 = 1;
        lVar20 = 0;
        do {
          lVar30 = lVar30 * ((phi_snd[lVar20] - plo_snd[lVar20]) + 1);
          lVar20 = lVar20 + 1;
        } while (local_6b8 != lVar20);
        count[0] = count[0] * iVar17;
        armci_write_strided((void *)((lVar27 * lVar18 + lVar11) * lVar19 + lVar14),local_67c,
                            stride_snd,count,local_6b0);
        if (GAme != uVar28) {
          iVar29 = (int)lVar30 * (int)local_688;
          uVar8 = (ulong)*(int *)((long)GA->nblock + lVar13 * 4 + local_6c8);
          iVar17 = (int)uVar28;
          if ((uVar8 & 1) == 0) {
            if ((*(byte *)(index + lVar13) & 1) == 0) {
              armci_msg_rcv(iVar23,local_6c0,(int)local_6a8,&msglen,iVar17);
            }
            else {
              armci_msg_snd(iVar23,local_6b0,iVar29,(int)local_6a0);
            }
            if ((*(byte *)(index + lVar13) & 1) == 0) {
              armci_msg_snd(iVar23,local_6b0,iVar29,(int)local_6a0);
              pcVar22 = local_6c0;
            }
            else {
LAB_0018ef08:
              pcVar22 = local_6c0;
              armci_msg_rcv(iVar23,local_6c0,(int)local_6a8,&msglen,iVar17);
            }
          }
          else {
            if ((index[lVar13] & 1U) == 0) {
              if (index[lVar13] != 0) {
                armci_msg_rcv(iVar23,local_6c0,(int)local_6a8,&msglen,iVar17);
              }
            }
            else {
              armci_msg_snd(iVar23,local_6b0,iVar29,(int)local_6a0);
            }
            uVar8 = uVar8 - 1;
            if ((index[lVar13] & 1U) == 0) {
              if (index[lVar13] != uVar8) {
                armci_msg_snd(iVar23,local_6b0,iVar29,(int)local_6a0);
              }
            }
            else {
              armci_msg_rcv(iVar23,local_6c0,(int)local_6a8,&msglen,iVar17);
            }
            uVar28 = index[lVar13];
            if (uVar28 == uVar8) {
              armci_msg_snd(iVar23,local_6b0,iVar29,(int)local_6a0);
              uVar28 = index[lVar13];
            }
            pcVar22 = local_6c0;
            if (uVar28 == 0) goto LAB_0018ef08;
          }
        }
        armci_read_strided((void *)((lVar25 * lVar15 + lVar31) * lVar19 + lVar14),local_67c,
                           stride_rcv,count,pcVar22);
        local_698 = local_698 + 2;
        IVar10 = local_6b8;
        puVar7 = local_658;
      }
      if (*(int *)((long)GA->block_dims + local_6c8 + -8) != 0) {
        increment[lVar13] = width[lVar13] * 2;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != IVar10);
  }
  pnga_free(local_6c0);
  pnga_free(local_6b0);
  free(map);
  free(puVar7);
  return 1;
}

Assistant:

logical pnga_update44_ghosts(Integer g_a)
{
  Integer idx, idir, i, np, handle=GA_OFFSET + g_a;
  Integer size, buflen, buftot, bufsize, ndim, increment[MAXDIM];
  Integer proc_rem_snd, proc_rem_rcv, pmax;
  Integer msgcnt, length;
  Integer width[MAXDIM], dims[MAXDIM], index[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_snd[MAXDIM], phi_snd[MAXDIM];
  Integer lo_rcv[MAXDIM], hi_rcv[MAXDIM];
  Integer slo_rcv[MAXDIM], shi_rcv[MAXDIM];
  Integer plo_rcv[MAXDIM], phi_rcv[MAXDIM];
  Integer ld_loc[MAXDIM];
  int msglen;
  int stride_snd[MAXDIM], stride_rcv[MAXDIM],count[MAXDIM];
  char *ptr_snd, *ptr_rcv;
  char send_name[32], rcv_name[32];
  void *snd_ptr, *rcv_ptr, *snd_ptr_orig, *rcv_ptr_orig;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* This routine makes use of the shift algorithm to update data in the
   * ghost cells bounding the local block of visible data. The shift
   * algorithm starts by updating the blocks of data along the first
   * dimension by grabbing a block of data that is width[0] deep but
   * otherwise matches the  dimensions of the data residing on the
   * calling processor. The update of the second dimension, however,
   * grabs a block that is width[1] deep in the second dimension but is
   * ldim0 + 2*width[0] in the first dimensions where ldim0 is the
   * size of the visible data along the first dimension. The remaining
   * dimensions are left the same. For the next update, the width of the
   * second dimension is also increased by 2*width[1] and so on. This
   * algorith makes use of the fact that data for the dimensions that
   * have already been updated is available on each processor and can be
   * used in the updates of subsequent dimensions. The total number of
   * separate updates is 2*ndim, an update in the negative and positive
   * directions for each dimension.
   *
   * This implementation make use of explicit message passing to perform
   * the update. Separate message types for the updates in each coordinate
   * direction are used to maintain synchronization locally and to
   * guarantee that the data is present before the updates in a new
   * coordinate direction take place.
   *
   * To perform the update, this routine makes use of several copies of
   * indices marking the upper and lower limits of data. Indices
   * beginning with the character "p" are relative indices marking the
   * location of the data set relative to the origin the local patch of
   * the global array, all other indices are in absolute coordinates and
   * mark locations in the total global array. The indices used by this
   * routine are described below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rcv[], hi_rcv[]: The lower and upper indices of the blocks
   *       of data that will be either sent to or received from a remote
   *       processor. These indices are NOT corrected for wrap-around
   *       (periodic) boundary conditions so they can be negative or greater
   *       than the array dimension values held in dims[].
   *
   *       slo_rcv[], shi_rcv[]: Similar to lo_rcv[] and hi_rcv[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions.
   *
   *       plo_rcv[], phi_rcv[]: The local indices of the local data patch
   *       that receive that message from the remote processor.
   *
   *       plo_snd[], phi_snd[]: The local indices of the data patch
   *       that will be sent to the remote processor. Note that the
   *       dimensions of the patches represented by plo_rec[], plo_rec[] and
   *       plo_snd[], phi_snd[] must be the same.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;

  /* initialize range increments and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater
     than the corresponding value in width[]. */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update44_ghosts:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update44_ghosts:malloc failed (_ga_proclist)",0);

  msgcnt = 0;

  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);
  /* Get indices of processor in virtual grid */
  pnga_proc_topology(g_a, me, index);

  /* Try to find maximum size of message that will be sent during
   * update operations and use this to allocate memory for message
   * passing buffers. */
  buftot = 1;
  for (i=0; i<ndim; i++) {
    buftot *= (hi_loc[i]-lo_loc[i] + 1 + 2*width[i]);
  }
  buflen = 1;
  for (i = 0; i < ndim; i++) {
    idir =  hi_loc[i] - lo_loc[i] + 1;
    if (buflen < (buftot/(idir + 2*width[i]))*width[i]) {
      buflen = (buftot/(idir + 2*width[i]))*width[i];
    }
  }
  bufsize = size*buflen;
  strcpy(send_name,"send_buffer");
  strcpy(rcv_name,"receive_buffer");
  snd_ptr_orig = snd_ptr = pnga_malloc(buflen, GA[handle].type, send_name);
  rcv_ptr_orig = rcv_ptr = pnga_malloc(buflen, GA[handle].type, rcv_name);

  /* loop over dimensions for sequential update using shift algorithm */
  for (idx=0; idx < ndim; idx++) {

    /* Do not bother with update if nwidth is zero */
    if (width[idx] != 0) {

      /* Perform update in negative direction. */
      get_remote_block_neg(idx, ndim, lo_loc, hi_loc, slo_rcv, shi_rcv,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      proc_rem_snd = _ga_proclist[0];
      if (p_handle >= 0) {
        proc_rem_snd = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem_snd];
      }

      /* Find processor from which data will be recieved */
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rcv[i] = hi_loc[i] + 1;
          hi_rcv[i] = hi_loc[i] + width[i];
        } else {
          lo_rcv[i] = lo_loc[i];
          hi_rcv[i] = hi_loc[i];
        }
      }

      /* Account for boundaries, if necessary. */
      for (i=0; i<ndim; i++) {
        if (i == idx) {
          if (hi_rcv[i] > dims[i]) {
            slo_rcv[i] = 1;
            shi_rcv[i] = width[i];
          } else {
            slo_rcv[i] = lo_rcv[i];
            shi_rcv[i] = hi_rcv[i];
          }
        } else {
          slo_rcv[i] = lo_rcv[i];
          shi_rcv[i] = hi_rcv[i];
        }
      }
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      proc_rem_rcv = _ga_proclist[0];
      if (p_handle >= 0) {
        proc_rem_rcv = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem_rcv];
      }

      /* Get actual coordinates of chunk of data that will be sent to
       * remote processor as well as coordinates of the array space that
       * will receive data from remote processor. */
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_snd[i] = width[i];
            phi_snd[i] = 2*width[i] - 1;
            plo_rcv[i] = hi_loc[i] - lo_loc[i] + width[i] + 1;
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + 2*width[i];
          } else {
            plo_snd[i] = width[i];
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = width[i];
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + width[i];
          }
        } else {
          plo_rcv[i] = 0;
          phi_rcv[i] = hi_loc[i] - lo_loc[i] + increment[i];
          plo_snd[i] = 0;
          phi_snd[i] = hi_loc[i] - lo_loc[i] + increment[i];
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_snd, &ptr_snd, ld_loc);
#if GHOST_PRINT
      printf("p[%d] 1: plo_snd[0]: %d plo_snd[1]: %d ptr_snd: %d\n",
          GAme, plo_snd[0], plo_snd[1], (Integer)ptr_snd);
      fflush(stdout);
#endif
      gam_LocationWithGhosts(me, handle, plo_rcv, &ptr_rcv, ld_loc);
#if GHOST_PRINT
      printf("p[%d] 1: plo_rcv[0]: %d plo_rcv[1]: %d ptr_rcv: %d\n",
          GAme, plo_rcv[0], plo_rcv[1], (Integer)ptr_rcv);
      fflush(stdout);
#endif

      /* Evaluate strides for send and recieve */
      gam_setstride(ndim, size, ld_loc, ld_loc, stride_rcv,
          stride_snd);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rcv, phi_rcv, count);
      gam_CountElems(ndim, plo_snd, phi_snd, &length);
      length *= size;
      count[0] *= size;

      /* Fill send buffer with data. */
#if GHOST_PRINT
      printf("p[%d]b 1: ptr_snd: %d ptr_rcv: %d\n", GAme, (Integer)ptr_snd,
              (Integer)ptr_rcv);
      printf("p[%d]b 1: length: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, (int)length, (int)proc_rem_snd, (int)proc_rem_rcv);
      printf("p[%d]b 1: count[0]: %d stride_rcv[0]: %d stride_rcv[1]: %d\n",
          GAme, count[0], stride_rcv[0],stride_rcv[1]);
      printf("p[%d]b 1: count[1]: %d stride_rcv[2]: %d stride_rcv[3]: %d\n",
          GAme, count[1], stride_rcv[2],stride_rcv[3]);
      printf("p[%d]b 1: count[2]: %d stride_snd[0]: %d stride_snd[1]: %d\n",
          GAme, count[2], stride_snd[0],stride_snd[1]);
      printf("p[%d]b 1: count[3]: %d stride_snd[2]: %d stride_snd[3]: %d\n",
          GAme, count[3], stride_snd[2],stride_snd[3]);
      printf("p[%d]b 1: snd_ptr: %d rcv_ptr: %d\n", GAme, (Integer)snd_ptr,
          (Integer)rcv_ptr);
      fflush(stdout);
#endif
      armci_write_strided(ptr_snd, (int)ndim-1, stride_snd, count, snd_ptr);

      /* Send Messages. If processor has odd index in direction idx, it
       * sends message first, if processor has even index it receives
       * message first. Then process is reversed. Also need to account
       * for whether or not there are an odd number of processors along
       * update direction. */

#if GHOST_PRINT
      printf("p[%d] 1: msgcnt: %d length: %d bufsize: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, msgcnt, length, bufsize, (int)proc_rem_snd, (int)proc_rem_rcv);
      fflush(stdout);
#endif
      snd_ptr = snd_ptr_orig;
      rcv_ptr = rcv_ptr_orig;
      if (GAme != proc_rem_snd) {
        if (GA[handle].nblock[idx]%2 == 0) {
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          } else {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          } else {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
        } else {
          pmax = GA[handle].nblock[idx] - 1;
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          } else if (index[idx] != pmax) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          } else if (index[idx] != 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
          /* make up for odd processor at end of string */
          if (index[idx] == 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
          if (index[idx] == pmax) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
        }
      } else {
        rcv_ptr = snd_ptr;
      }
      msgcnt++;
      /* copy data back into global array */
      armci_read_strided(ptr_rcv, (int)ndim-1, stride_rcv, count, rcv_ptr);

      /* Find parameters for message in positive direction. */
      get_remote_block_pos(idx, ndim, lo_loc, hi_loc, slo_rcv, shi_rcv,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      proc_rem_snd = _ga_proclist[0];
      if (p_handle >= 0) {
        proc_rem_snd = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem_snd];
      }

      /* Find processor from which data will be recieved */
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rcv[i] = lo_loc[i] - width[i];
          hi_rcv[i] = lo_loc[i] - 1;
        } else {
          lo_rcv[i] = lo_loc[i];
          hi_rcv[i] = hi_loc[i];
        }
      }

      /* Account for boundaries, if necessary. */
      for (i=0; i<ndim; i++) {
        if (i == idx) {
          if (hi_rcv[i] < 1) {
            slo_rcv[i] = dims[i] - width[i] + 1;
            shi_rcv[i] = dims[i];
          } else {
            slo_rcv[i] = lo_rcv[i];
            shi_rcv[i] = hi_rcv[i];
          }
        } else {
          slo_rcv[i] = lo_rcv[i];
          shi_rcv[i] = hi_rcv[i];
        }
      }
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      proc_rem_rcv = _ga_proclist[0];
      if (p_handle >= 0) {
        proc_rem_rcv = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem_rcv];
      }
      /* Get actual coordinates of chunk of data that will be sent to
       * remote processor as well as coordinates of the array space that
       * will receive data from remote processor. */
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_snd[i] = hi_loc[i] - lo_loc[i] + 1;
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = 0;
            phi_rcv[i] = width[i] - 1;
          } else {
            plo_snd[i] = width[i];
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = width[i];
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + width[i];
          }
        } else {
          plo_rcv[i] = 0;
          phi_rcv[i] = hi_loc[i] - lo_loc[i] + increment[i];
          plo_snd[i] = 0;
          phi_snd[i] = hi_loc[i] - lo_loc[i] + increment[i];
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_snd, &ptr_snd, ld_loc);
#if GHOST_PRINT
      printf("p[%d] 2: plo_snd[0]: %d plo_snd[1]: %d ptr_snd: %d\n",
          GAme, plo_snd[0], plo_snd[1], (Integer)ptr_snd);
      fflush(stdout);
#endif
      gam_LocationWithGhosts(me, handle, plo_rcv, &ptr_rcv, ld_loc);
#if GHOST_PRINT
      printf("p[%d] 2: plo_rcv[0]: %d plo_rcv[1]: %d ptr_rcv: %d\n",
          GAme, plo_rcv[0], plo_rcv[1], (Integer)ptr_rcv);
      fflush(stdout);
#endif

      /* Evaluate strides for send and recieve */
      gam_setstride(ndim, size, ld_loc, ld_loc, stride_rcv,
          stride_snd);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rcv, phi_rcv, count);
      gam_CountElems(ndim, plo_snd, phi_snd, &length);
      length *= size;
      count[0] *= size;

      /* Need to reallocate memory if length > buflen */
      /* TO DO */

      /* Fill send buffer with data. */
#if GHOST_PRINT
      printf("p[%d]b 2: ptr_snd: %d ptr_rcv: %d\n", GAme, (Integer)ptr_snd,
              (Integer)ptr_rcv);
      printf("p[%d]b 2: length: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, (int)length, (int)proc_rem_snd, (int)proc_rem_rcv);
      printf("p[%d]b 2: count[0]: %d stride_rcv[0]: %d stride_rcv[1]: %d\n",
          GAme, count[0], stride_rcv[0],stride_rcv[1]);
      printf("p[%d]b 2: count[1]: %d stride_rcv[2]: %d stride_rcv[3]: %d\n",
          GAme, count[1], stride_rcv[2],stride_rcv[3]);
      printf("p[%d]b 2: count[2]: %d stride_snd[0]: %d stride_snd[1]: %d\n",
          GAme, count[2], stride_snd[0],stride_snd[1]);
      printf("p[%d]b 2: count[3]: %d stride_snd[2]: %d stride_snd[3]: %d\n",
          GAme, count[3], stride_snd[2],stride_snd[3]);
      printf("p[%d]b 2: snd_ptr: %d rcv_ptr: %d\n", GAme, (Integer)snd_ptr,
          (Integer)rcv_ptr);
      fflush(stdout);
#endif
      armci_write_strided(ptr_snd, (int)ndim-1, stride_snd, count, snd_ptr);

      /* Send Messages. If processor has odd index in direction idx, it
       * sends message first, if processor has even index it receives
       * message first. Then process is reversed. Also need to account
       * for whether or not there are an odd number of processors along
       * update direction. */

#if GHOST_PRINT
      printf("p[%d] 2: msgcnt: %d length: %d bufsize: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, msgcnt, length, bufsize, (int)proc_rem_snd, (int)proc_rem_rcv);
      fflush(stdout);
#endif
      snd_ptr = snd_ptr_orig;
      rcv_ptr = rcv_ptr_orig;
      if (GAme != proc_rem_rcv) {
        if (GA[handle].nblock[idx]%2 == 0) {
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          } else {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          } else {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
        } else {
          pmax = GA[handle].nblock[idx] - 1;
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          } else if (index[idx] != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          } else if (index[idx] != pmax) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
          /* make up for odd processor at end of string */
          if (index[idx] == pmax) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
          if (index[idx] == 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
        }
      } else {
        rcv_ptr = snd_ptr;
      }
      /* copy data back into global array */
      armci_read_strided(ptr_rcv, (int)ndim-1, stride_rcv, count, rcv_ptr);
      msgcnt++;
    }
    if (GA[handle].corner_flag)
      increment[idx] = 2*width[idx];
  }

  pnga_free(rcv_ptr_orig);
  pnga_free(snd_ptr_orig);
  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}